

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O0

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<
          (iuStreamMessage *this,basic_string_view<char32_t,_std::char_traits<char32_t>_> *value)

{
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_RDX;
  string local_38;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *local_18;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *value_local;
  iuStreamMessage *this_local;
  
  local_18 = value;
  value_local = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)this;
  PrintToString<std::basic_string_view<char32_t,std::char_traits<char32_t>>>
            (&local_38,(iutest *)value,in_RDX);
  std::operator<<((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(string *)&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }